

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

void __thiscall
VertexAttrib64Bit::LimitTest::getProgramDetails
          (LimitTest *this,_iteration iteration,bool use_arrays,bool use_locations,
          bool use_vertex_attrib_divisor,string *out_varying_name,string *out_vertex_shader_code)

{
  ostream *poVar1;
  string local_258 [32];
  int local_238;
  int local_234;
  GLint element_1;
  GLint element;
  GLint attribute_ordinal;
  GLint attribute_1;
  GLchar *type_name_1;
  int local_218;
  GLint n_elements;
  GLint n_type_1;
  GLint location_1;
  GLint location;
  GLint attribute;
  GLchar *type_name;
  int local_1f8;
  GLint attribute_offset;
  GLint n_type;
  char *local_1e8;
  GLchar *advancement_str;
  stringstream stream;
  ostream local_1d0;
  int local_58;
  int local_54;
  GLint n_types;
  GLint n_attributes;
  attributeConfiguration configuration;
  string *out_varying_name_local;
  bool use_vertex_attrib_divisor_local;
  bool use_locations_local;
  bool use_arrays_local;
  _iteration iteration_local;
  LimitTest *this_local;
  
  configuration._40_8_ = out_varying_name;
  attributeConfiguration::attributeConfiguration((attributeConfiguration *)&n_types);
  local_54 = 0;
  local_58 = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)&advancement_str);
  local_1e8 = "gl_VertexID";
  if (use_vertex_attrib_divisor) {
    local_1e8 = "gl_InstanceID";
  }
  getVertexArrayConfiguration(this,iteration,(attributeConfiguration *)&n_types);
  local_54 = n_types;
  local_58 = (int)configuration.m_n_rows;
  std::operator<<(&local_1d0,
                  "#version 400\n#extension GL_ARB_vertex_attrib_64bit : require\n\nprecision highp float;\n\n"
                 );
  for (local_1f8 = 0; local_1f8 < local_58; local_1f8 = local_1f8 + 1) {
    type_name._4_4_ = local_1f8 * local_54;
    _location = *(char **)(configuration._24_8_ + (long)local_1f8 * 8);
    poVar1 = std::operator<<(&local_1d0,"// ");
    poVar1 = std::operator<<(poVar1,_location);
    std::operator<<(poVar1,"\n");
    if (use_arrays) {
      if (use_locations) {
        n_elements = calculateAttributeLocation
                               (this,(attributeConfiguration *)&n_types,-1,local_1f8);
        poVar1 = std::operator<<(&local_1d0,"layout(location = ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,n_elements);
        std::operator<<(poVar1,") ");
      }
      poVar1 = std::operator<<(&local_1d0,"in ");
      poVar1 = std::operator<<(poVar1,_location);
      poVar1 = std::operator<<(poVar1," attribute_");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1f8);
      poVar1 = std::operator<<(poVar1,"[");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_54);
      std::operator<<(poVar1,"];\n");
    }
    else {
      for (location_1 = 0; location_1 < local_54; location_1 = location_1 + 1) {
        if (use_locations) {
          n_type_1 = calculateAttributeLocation
                               (this,(attributeConfiguration *)&n_types,location_1,local_1f8);
          poVar1 = std::operator<<(&local_1d0,"layout(location = ");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,n_type_1);
          std::operator<<(poVar1,") ");
        }
        poVar1 = std::operator<<(&local_1d0,"in ");
        poVar1 = std::operator<<(poVar1,_location);
        poVar1 = std::operator<<(poVar1," attribute_");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,location_1 + type_name._4_4_);
        std::operator<<(poVar1,";\n");
      }
    }
    std::operator<<(&local_1d0,"\n");
  }
  poVar1 = std::operator<<(&local_1d0,"out int ");
  poVar1 = std::operator<<(poVar1,getProgramDetails::varying_name);
  std::operator<<(poVar1,";\n\n");
  std::operator<<(&local_1d0,"void main()\n{\n");
  for (local_218 = 0; local_218 < local_58; local_218 = local_218 + 1) {
    type_name_1._4_4_ = *(int *)(configuration._0_8_ + (long)local_218 * 4);
    _attribute_ordinal = *(char **)(configuration._24_8_ + (long)local_218 * 8);
    poVar1 = std::operator<<(&local_1d0,"// ");
    poVar1 = std::operator<<(poVar1,_attribute_ordinal);
    std::operator<<(poVar1,"\n");
    for (element = 0; element < local_54; element = element + 1) {
      element_1 = element + local_218 * local_54;
      if (element_1 == 0) {
        std::operator<<(&local_1d0,"    if (attribute_");
      }
      else {
        std::operator<<(&local_1d0,"    else if (attribute_");
      }
      if (use_arrays) {
        poVar1 = (ostream *)std::ostream::operator<<(&local_1d0,local_218);
        poVar1 = std::operator<<(poVar1,"[");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,element);
        std::operator<<(poVar1,"]");
      }
      else {
        std::ostream::operator<<(&local_1d0,element_1);
      }
      poVar1 = std::operator<<(&local_1d0," != ");
      poVar1 = std::operator<<(poVar1,_attribute_ordinal);
      std::operator<<(poVar1,"(");
      if (iteration == DOUBLE_DVEC2) {
        if (type_name_1._4_4_ == 1) {
          poVar1 = (ostream *)std::ostream::operator<<(&local_1d0,element_1);
          poVar1 = std::operator<<(poVar1," + ");
          poVar1 = std::operator<<(poVar1,local_1e8);
          std::operator<<(poVar1," * 2");
        }
        else {
          poVar1 = (ostream *)std::ostream::operator<<(&local_1d0,element_1);
          poVar1 = std::operator<<(poVar1," + ");
          poVar1 = std::operator<<(poVar1,local_1e8);
          poVar1 = std::operator<<(poVar1," * 3 + 1");
          poVar1 = std::operator<<(poVar1,", ");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,element_1);
          poVar1 = std::operator<<(poVar1," + ");
          poVar1 = std::operator<<(poVar1,local_1e8);
          std::operator<<(poVar1," * 3 + 2");
        }
      }
      else if (iteration == DVEC3_DVEC4) {
        for (local_234 = 0; local_234 < type_name_1._4_4_; local_234 = local_234 + 1) {
          poVar1 = (ostream *)std::ostream::operator<<(&local_1d0,element_1);
          poVar1 = std::operator<<(poVar1," + ");
          poVar1 = std::operator<<(poVar1,local_1e8);
          poVar1 = std::operator<<(poVar1," * ");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,type_name_1._4_4_);
          poVar1 = std::operator<<(poVar1," + ");
          std::ostream::operator<<(poVar1,local_234);
          if (type_name_1._4_4_ != local_234 + 1) {
            std::operator<<(&local_1d0,", ");
          }
        }
      }
      else if (iteration - DMAT2 < 5) {
        for (local_238 = 0; local_238 < type_name_1._4_4_; local_238 = local_238 + 1) {
          poVar1 = (ostream *)std::ostream::operator<<(&local_1d0,local_218);
          poVar1 = std::operator<<(poVar1," + ");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,element_1);
          poVar1 = std::operator<<(poVar1," + ");
          poVar1 = std::operator<<(poVar1,local_1e8);
          poVar1 = std::operator<<(poVar1," * 16 + ");
          std::ostream::operator<<(poVar1,local_238);
          if (type_name_1._4_4_ != local_238 + 1) {
            std::operator<<(&local_1d0,", ");
          }
        }
      }
      poVar1 = std::operator<<(&local_1d0,"))\n");
      poVar1 = std::operator<<(poVar1,"    {\n");
      poVar1 = std::operator<<(poVar1,"        ");
      poVar1 = std::operator<<(poVar1,getProgramDetails::varying_name);
      poVar1 = std::operator<<(poVar1," = 0;\n");
      std::operator<<(poVar1,"    }\n");
    }
  }
  poVar1 = std::operator<<(&local_1d0,"    else\n");
  poVar1 = std::operator<<(poVar1,"    {\n");
  poVar1 = std::operator<<(poVar1,"        ");
  poVar1 = std::operator<<(poVar1,getProgramDetails::varying_name);
  poVar1 = std::operator<<(poVar1," = 1;\n");
  poVar1 = std::operator<<(poVar1,"    }\n");
  std::operator<<(poVar1,"}\n\n");
  std::__cxx11::string::operator=((string *)configuration._40_8_,getProgramDetails::varying_name);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)out_vertex_shader_code,local_258);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::stringstream::~stringstream((stringstream *)&advancement_str);
  return;
}

Assistant:

void LimitTest::getProgramDetails(_iteration iteration, bool use_arrays, bool use_locations,
								  bool use_vertex_attrib_divisor, std::string& out_varying_name,
								  std::string& out_vertex_shader_code) const
{
	static const GLchar* varying_name = "vs_output_value";

	attributeConfiguration configuration;
	GLint				   n_attributes = 0;
	GLint				   n_types		= 0;
	std::stringstream	  stream;

	const GLchar* advancement_str = (true == use_vertex_attrib_divisor) ? "gl_InstanceID" : "gl_VertexID";

	getVertexArrayConfiguration(iteration, configuration);

	n_attributes = configuration.m_n_attributes_per_group;
	n_types		 = configuration.m_n_types;

	/* Preamble */
	stream << "#version 400\n"
			  "#extension GL_ARB_vertex_attrib_64bit : require\n"
			  "\n"
			  "precision highp float;\n"
			  "\n";

	/* Attribute declarations */
	/* Spearated attributes are called: attribute_ORDINAL, arrayed: attribute_N_TYPE */
	for (GLint n_type = 0; n_type < n_types; ++n_type)
	{
		const GLint   attribute_offset = n_type * n_attributes;
		const GLchar* type_name		   = configuration.m_type_names[n_type];

		stream << "// " << type_name << "\n";

		if (false == use_arrays)
		{
			for (GLint attribute = 0; attribute < n_attributes; ++attribute)
			{
				if (true == use_locations)
				{
					const GLint location = calculateAttributeLocation(configuration, attribute, n_type);

					stream << "layout(location = " << location << ") ";
				}

				stream << "in " << type_name << " attribute_" << attribute + attribute_offset << ";\n";
			}
		}
		else
		{
			if (true == use_locations)
			{
				const GLint location = calculateAttributeLocation(configuration, m_array_attribute, n_type);

				stream << "layout(location = " << location << ") ";
			}

			stream << "in " << type_name << " attribute_" << n_type << "[" << n_attributes << "];\n";
		}

		stream << "\n";
	}

	/* Varying declaration */
	stream << "out int " << varying_name << ";\n\n";

	/* Main */
	stream << "void main()\n"
			  "{\n";

	for (GLint n_type = 0; n_type < n_types; ++n_type)
	{
		const GLint   n_elements = configuration.m_n_elements[n_type];
		const GLchar* type_name  = configuration.m_type_names[n_type];

		stream << "// " << type_name << "\n";

		/* if (attribute_name != type(values))
		 * {
		 *     varying = 0;
		 * }
		 */
		for (GLint attribute = 0; attribute < n_attributes; ++attribute)
		{
			const GLint attribute_ordinal = attribute + n_type * n_attributes;

			/* First attribute is verified with "if", rest with "else if" */
			if (0 == attribute_ordinal)
			{
				stream << "    if (attribute_";
			}
			else
			{
				stream << "    else if (attribute_";
			}

			/* Spearated attributes are called: attribute_ORDINAL, arrayed: attribute_N_TYPE[INDEX] */
			if (false == use_arrays)
			{
				stream << attribute_ordinal;
			}
			else
			{
				stream << n_type << "[" << attribute << "]";
			}

			/* != type() */
			stream << " != " << type_name << "(";

			/* Values for type constructor, depend on iteration */
			switch (iteration)
			{
			case DOUBLE_DVEC2:

				/* Double attributes should be assigned the value:
				 (n_attribute + gl_VertexID * 2) */
				/* Dvec2 attribute components should be assigned the following
				 vector values:
				 (n_attribute + gl_VertexID * 3 + 1,
				 n_attribute + gl_VertexID * 3 + 2)*/

				if (1 == n_elements)
				{
					stream << attribute_ordinal << " + " << advancement_str << " * 2";
				}
				else
				{
					stream << attribute_ordinal << " + " << advancement_str << " * 3 + 1"
						   << ", " << attribute_ordinal << " + " << advancement_str << " * 3 + 2";
				}

				break;

			case DVEC3_DVEC4:

				/* Dvec3 attribute components should be assigned the following
				 vector values:
				 (n_attribute + gl_VertexID * 3 + 0,
				 n_attribute + gl_VertexID * 3 + 1,
				 n_attribute + gl_VertexID * 3 + 2).

				 Dvec4 attribute components should be assigned the following
				 vector values:
				 (n_attribute + gl_VertexID * 4 + 0,
				 n_attribute + gl_VertexID * 4 + 1,
				 n_attribute + gl_VertexID * 4 + 2,
				 n_attribute + gl_VertexID * 4 + 3).*/

				for (GLint element = 0; element < n_elements; ++element)
				{
					stream << attribute_ordinal << " + " << advancement_str << " * " << n_elements << " + " << element;

					if (n_elements != element + 1)
					{
						stream << ", ";
					}
				}

				break;

			case DMAT2:
			case DMAT3X2_DMAT4X2:
			case DMAT2X3_DMAT2X4:
			case DMAT3_DMAT3X4:
			case DMAT4X3_DMAT4:

				/* Subsequent matrix elements should be assigned the following value:
				 (n_type + n_attribute + gl_VertexID * 16 + n_value)*/

				for (GLint element = 0; element < n_elements; ++element)
				{
					stream << n_type << " + " << attribute_ordinal << " + " << advancement_str << " * 16 + " << element;

					if (n_elements != element + 1)
					{
						stream << ", ";
					}
				}

				break;
			}

			/* type() { varying = 0 } */
			stream << "))\n"
				   << "    {\n"
				   << "        " << varying_name << " = 0;\n"
				   << "    }\n";
		}
	}

	/* All attributes verified: else { varyin = 1 }
	 Close main body */
	stream << "    else\n"
		   << "    {\n"
		   << "        " << varying_name << " = 1;\n"
		   << "    }\n"
		   << "}\n\n";

	/* Store results */
	out_varying_name	   = varying_name;
	out_vertex_shader_code = stream.str();
}